

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

QMetaCallEvent *
QMetaCallEvent::create_impl
          (SlotObjUniquePtr slotObj,QObject *sender,int signal_index,size_t argc,void **argp,
          QMetaType *metaTypes)

{
  __atomic_base<int> _Var1;
  void **ppvVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> local_50;
  int local_44;
  QObject *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_head_impl = (QSlotObjectBase *)&DAT_aaaaaaaaaaaaaaaa;
  local_44 = signal_index;
  local_40 = sender;
  std::
  make_unique<QMetaCallEvent,std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>,QObject_const*&,int&,int>
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &local_50,
             (QObject **)
             slotObj._M_t.
             super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>.
             _M_t.
             super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
             .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl,
             (int *)&local_40,&local_44);
  ppvVar2 = *(void ***)(local_50._M_head_impl + 3);
  _Var1._M_i = local_50._M_head_impl[4].m_ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i;
  lVar5 = 0;
  lVar4 = 0;
  do {
    if (-lVar4 == argc) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (QMetaCallEvent *)local_50._M_head_impl;
      }
      goto LAB_00288d04;
    }
    *(undefined8 *)((long)ppvVar2 + lVar5 + (long)_Var1._M_i * 8) =
         *(undefined8 *)((long)&metaTypes->d_ptr + lVar5);
    pvVar3 = QMetaType::create((QMetaType *)((long)ppvVar2 + lVar5 + (long)_Var1._M_i * 8),
                               *(void **)((long)argp + lVar5));
    *(void **)((long)ppvVar2 + lVar5) = pvVar3;
    lVar5 = lVar5 + 8;
    bVar6 = lVar4 == 0;
    lVar4 = lVar4 + -1;
  } while ((bVar6) || (pvVar3 != (void *)0x0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qBadAlloc();
  }
LAB_00288d04:
  __stack_chk_fail();
}

Assistant:

QMetaCallEvent* QMetaCallEvent::create_impl(QtPrivate::SlotObjUniquePtr slotObj,
                                            const QObject *sender, int signal_index,
                                            size_t argc, const void* const argp[],
                                            const QMetaType metaTypes[])
{
    auto metaCallEvent = std::make_unique<QMetaCallEvent>(std::move(slotObj), sender,
                                                          signal_index, int(argc));

    void **args = metaCallEvent->args();
    QMetaType *types = metaCallEvent->types();
    for (size_t i = 0; i < argc; ++i) {
        types[i] = metaTypes[i];
        args[i] = types[i].create(argp[i]);
        Q_CHECK_PTR(!i || args[i]);
    }

    return metaCallEvent.release();
}